

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

void acutest_timer_print_diff_(void)

{
  printf("%.6lf secs",
         (((double)acutest_timer_end_.tv_nsec + (double)acutest_timer_end_.tv_sec * 1000000000.0) -
         ((double)acutest_timer_start_.tv_nsec + (double)acutest_timer_start_.tv_sec * 1000000000.0)
         ) / 1000000000.0);
  return;
}

Assistant:

static double
    acutest_timer_diff_(struct timespec start, struct timespec end)
    {
        double endns;
        double startns;

        endns = end.tv_sec;
        endns *= 1e9;
        endns += end.tv_nsec;

        startns = start.tv_sec;
        startns *= 1e9;
        startns += start.tv_nsec;

        return ((endns - startns)/ 1e9);
    }